

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::operator<<(ostream *s,
                           DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *m)

{
  ostream *poVar1;
  allocator local_1e6;
  allocator local_1e5;
  allocator local_1e4;
  allocator local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  Matrix<double,__1,__1,_1,__1,__1> local_1e0;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  IOFormat local_108;
  
  Matrix<double,-1,-1,1,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_1e0,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)m);
  std::__cxx11::string::string((string *)&local_188," ",&local_1e1);
  std::__cxx11::string::string((string *)&local_1a8,"\n",&local_1e2);
  std::__cxx11::string::string((string *)&local_1c8,"",&local_1e3);
  std::__cxx11::string::string((string *)&local_128,"",&local_1e4);
  std::__cxx11::string::string((string *)&local_148,"",&local_1e5);
  std::__cxx11::string::string((string *)&local_168,"",&local_1e6);
  IOFormat::IOFormat(&local_108,-1,0,&local_188,&local_1a8,&local_1c8,&local_128,&local_148,
                     &local_168);
  poVar1 = internal::print_matrix<Eigen::Matrix<double,_1,_1,1,_1,_1>>(s,&local_1e0,&local_108);
  IOFormat::~IOFormat(&local_108);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  free(local_1e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}